

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O1

int mbedtls_chachapoly_auth_decrypt
              (mbedtls_chachapoly_context *ctx,size_t length,uchar *nonce,uchar *aad,size_t aad_len,
              uchar *tag,uchar *input,uchar *output)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uchar check_tag [16];
  
  iVar2 = chachapoly_crypt_and_tag
                    (ctx,MBEDTLS_CHACHAPOLY_DECRYPT,length,nonce,aad,aad_len,input,output,check_tag)
  ;
  if (iVar2 == 0) {
    bVar1 = 0;
    lVar3 = 0;
    do {
      bVar1 = bVar1 | check_tag[lVar3] ^ tag[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    if (bVar1 == 0) {
      iVar2 = 0;
    }
    else {
      mbedtls_platform_zeroize(output,length);
      iVar2 = -0x56;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_chachapoly_auth_decrypt( mbedtls_chachapoly_context *ctx,
                                     size_t length,
                                     const unsigned char nonce[12],
                                     const unsigned char *aad,
                                     size_t aad_len,
                                     const unsigned char tag[16],
                                     const unsigned char *input,
                                     unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char check_tag[16];
    size_t i;
    int diff;
    CHACHAPOLY_VALIDATE_RET( ctx   != NULL );
    CHACHAPOLY_VALIDATE_RET( nonce != NULL );
    CHACHAPOLY_VALIDATE_RET( tag   != NULL );
    CHACHAPOLY_VALIDATE_RET( aad_len == 0 || aad    != NULL );
    CHACHAPOLY_VALIDATE_RET( length  == 0 || input  != NULL );
    CHACHAPOLY_VALIDATE_RET( length  == 0 || output != NULL );

    if( ( ret = chachapoly_crypt_and_tag( ctx,
                        MBEDTLS_CHACHAPOLY_DECRYPT, length, nonce,
                        aad, aad_len, input, output, check_tag ) ) != 0 )
    {
        return( ret );
    }

    /* Check tag in "constant-time" */
    for( diff = 0, i = 0; i < sizeof( check_tag ); i++ )
        diff |= tag[i] ^ check_tag[i];

    if( diff != 0 )
    {
        mbedtls_platform_zeroize( output, length );
        return( MBEDTLS_ERR_CHACHAPOLY_AUTH_FAILED );
    }

    return( 0 );
}